

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void __thiscall double_conversion::StringBuilder::AddString(StringBuilder *this,char *s)

{
  size_t sVar1;
  
  sVar1 = strlen(s);
  AddSubstring(this,s,(int)sVar1);
  return;
}

Assistant:

void AddString(const char* s) {
    AddSubstring(s, StrLength(s));
  }